

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wat-parser.cpp
# Opt level: O1

void __thiscall
wasm::WATParser::anon_unknown_11::WithPosition<wasm::WATParser::(anonymous_namespace)::ParseDefsCtx>
::~WithPosition(WithPosition<wasm::WATParser::(anonymous_namespace)::ParseDefsCtx> *this)

{
  ParseDefsCtx *pPVar1;
  ParseInput *this_00;
  
  pPVar1 = this->ctx;
  (pPVar1->in).lexer.index = (ulong)this->original;
  this_00 = &pPVar1->in;
  Lexer::skipSpace(&this_00->lexer);
  Lexer::lexToken(&this_00->lexer);
  return;
}

Assistant:

~WithPosition() { ctx.in.lexer.setIndex(original); }